

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

string * __thiscall
cmQtAutoGenerators::ListQt5RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,cmTarget *target
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *depends)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  string *psVar5;
  istream *piVar6;
  long lVar7;
  ostream *poVar8;
  string oline;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qrcEntries;
  string rccStdErr;
  string rccStdOut;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string absFile;
  string rccCommand;
  istringstream ostr;
  string local_2e8;
  string *local_2c8;
  int local_2bc;
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  string local_278;
  string local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  string local_210;
  long *local_1f0 [2];
  long local_1e0 [2];
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [3];
  ios_base local_138 [264];
  
  local_2c8 = __return_storage_ptr__;
  local_220 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends;
  GetRccExecutable_abi_cxx11_(&local_1d0,this,target);
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_238,&local_1d0);
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"--list","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238,
             local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,local_1b0[0].field_2._M_allocated_capacity + 1);
  }
  psVar5 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  cmsys::SystemTools::GetRealPath(&local_210,psVar5,(string *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_238,&local_210);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  local_2bc = 0;
  bVar2 = cmSystemTools::RunSingleCommand
                    (&local_238,&local_258,&local_278,&local_2bc,(char *)0x0,OUTPUT_NONE,0.0);
  if (bVar2 && local_2bc == 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_258,_S_in);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0]._M_dataplus._M_p + -0x18) +
                              (char)local_1b0);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_2e8,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      cmQtAutoGeneratorsStripCR(&local_2b8,&local_2e8);
      std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if (local_2e8._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_298,&local_2e8);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                               local_2e8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_278,_S_in);
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_local_buf[0] = '\0';
    local_218 = &local_2c8->field_2;
    do {
      do {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_1b0[0]._M_dataplus._M_p + -0x18) +
                                (char)local_1b0);
        piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b0,(string *)&local_2e8,cVar3);
        if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,
                            CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                     local_2e8.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
          std::ios_base::~ios_base(local_138);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (local_220,*(undefined8 *)(local_220 + 8),
                     local_298.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_298.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (local_2c8,&local_298,"@list_sep@");
          goto LAB_002e6d35;
        }
        cmQtAutoGeneratorsStripCR(&local_2b8,&local_2e8);
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_1f0[0] = local_1e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f0,local_2e8._M_dataplus._M_p,
                   local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
        plVar1 = local_1f0[0];
        iVar4 = strncmp((char *)local_1f0[0],"RCC: Error in",0xd);
        if (plVar1 != local_1e0) {
          operator_delete(plVar1,local_1e0[0] + 1);
        }
      } while (iVar4 != 0);
      if (ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::searchString_abi_cxx11_ == '\0') {
        iVar4 = __cxa_guard_acquire(&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::searchString_abi_cxx11_);
        if (iVar4 != 0) {
          ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
          ::searchString_abi_cxx11_._M_dataplus._M_p =
               (pointer)&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                         ::searchString_abi_cxx11_.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                      ::searchString_abi_cxx11_,"Cannot find file \'","");
          __cxa_atexit(std::__cxx11::string::~string,
                       &ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                        ::searchString_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                               ::searchString_abi_cxx11_);
        }
      }
      lVar7 = std::__cxx11::string::find
                        ((char *)&local_2e8,
                         (ulong)ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                ::searchString_abi_cxx11_._M_dataplus._M_p,0);
      if (lVar7 == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"AUTOGEN: error: Rcc lists unparsable output ",0x2c);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_2e8._M_dataplus._M_p,
                            local_2e8._M_string_length);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        (local_2c8->_M_dataplus)._M_p = (pointer)local_218;
        local_2c8->_M_string_length = 0;
        (local_2c8->field_2)._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::substr((ulong)&local_2b8,(ulong)&local_2e8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   &local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
    } while (lVar7 != -1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                               local_2e8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AUTOGEN: error: Rcc list process for ",0x25);
    psVar5 = cmSourceFile::GetFullPath(sf,(string *)0x0);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," failed:\n",9);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_258._M_dataplus._M_p,local_258._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_278._M_dataplus._M_p,local_278._M_string_length);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    (local_2c8->_M_dataplus)._M_p = (pointer)&local_2c8->field_2;
    local_2c8->_M_string_length = 0;
    (local_2c8->field_2)._M_local_buf[0] = '\0';
  }
LAB_002e6d35:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return local_2c8;
}

Assistant:

std::string cmQtAutoGenerators::ListQt5RccInputs(cmSourceFile* sf,
                                            cmTarget const* target,
                                            std::vector<std::string>& depends)
{
  std::string rccCommand = this->GetRccExecutable(target);
  std::vector<std::string> qrcEntries;

  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back("--list");

  std::string absFile = cmsys::SystemTools::GetRealPath(
                                              sf->GetFullPath());

  command.push_back(absFile);

  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (!result || retVal)
    {
    std::cerr << "AUTOGEN: error: Rcc list process for " << sf->GetFullPath()
              << " failed:\n" << rccStdOut << "\n" << rccStdErr << std::endl;
    return std::string();
    }

  {
  std::istringstream ostr(rccStdOut);
  std::string oline;
  while(std::getline(ostr, oline))
    {
    oline = cmQtAutoGeneratorsStripCR(oline);
    if(!oline.empty())
      {
      qrcEntries.push_back(oline);
      }
    }
  }

  {
  std::istringstream estr(rccStdErr);
  std::string eline;
  while(std::getline(estr, eline))
    {
    eline = cmQtAutoGeneratorsStripCR(eline);
    if (cmHasLiteralPrefix(eline, "RCC: Error in"))
      {
      static std::string searchString = "Cannot find file '";

      std::string::size_type pos = eline.find(searchString);
      if (pos == std::string::npos)
        {
        std::cerr << "AUTOGEN: error: Rcc lists unparsable output "
                  << eline << std::endl;
        return std::string();
        }
      pos += searchString.length();
      std::string::size_type sz = eline.size() - pos - 1;
      qrcEntries.push_back(eline.substr(pos, sz));
      }
    }
  }

  depends.insert(depends.end(), qrcEntries.begin(), qrcEntries.end());
  return cmJoin(qrcEntries, "@list_sep@");
}